

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O2

bool check_location_aliasing
               (explicit_location_info (*explicit_locations) [4],ir_variable *var,uint location,
               uint component,uint location_limit,glsl_type *type,uint interpolation,bool centroid,
               bool sample,bool patch,gl_shader_program *prog,gl_shader_stage stage)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  glsl_type *pgVar4;
  char *pcVar5;
  byte bVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  char *fmt;
  uint uVar10;
  bool *pbVar11;
  uint uVar12;
  bool bVar13;
  bool local_40;
  
  pgVar4 = glsl_type::without_array(type);
  uVar12 = *(uint *)&pgVar4->field_0x4;
  bVar8 = (byte)uVar12;
  if ((0xd < bVar8) || (bVar1 = true, (0x3fe3U >> (uVar12 & 0xf) & 1) == 0)) {
    local_40 = false;
    bVar1 = false;
    if (bVar8 == 0xf) {
      uVar9 = 4;
      bVar1 = true;
      uVar12 = 0;
      goto LAB_001dfaf4;
    }
  }
  local_40 = bVar1;
  bVar6 = 0;
  if ((byte)(uVar12 - 4) < 10) {
    bVar6 = (byte)*(undefined4 *)(&DAT_0021bac0 + (ulong)(uVar12 - 4 & 0xff) * 4);
  }
  if (bVar8 < 0x14) {
    uVar9 = ((uint)pgVar4->vector_elements << (bVar6 & 0x1f)) + component;
    switch(uVar12 & 0xff) {
    case 0:
    case 1:
    case 2:
    case 0x13:
      uVar12 = 0x20;
      break;
    case 3:
    case 7:
    case 8:
      uVar12 = 0x10;
      break;
    default:
      uVar12 = 0x40;
      break;
    case 5:
    case 6:
      uVar12 = 8;
      break;
    case 0xb:
      uVar12 = 1;
      break;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
      goto switchD_001dfadc_caseD_e;
    }
    bVar1 = false;
LAB_001dfaf4:
LAB_001dfb0b:
    uVar10 = location;
    if (location_limit <= location) {
LAB_001dfdd9:
      return location_limit <= location;
    }
    do {
      pbVar11 = &explicit_locations[uVar10][0].patch;
      uVar2 = 0;
      do {
        if (3 < uVar2) {
          location = uVar10 + 1;
          goto LAB_001dfb0b;
        }
        if (((explicit_location_info *)(pbVar11 + -0x16))->var != (ir_variable *)0x0) {
          pgVar4 = glsl_type::without_array
                             (((explicit_location_info *)(pbVar11 + -0x16))->var->type);
          if ((bool)(~bVar1 & pgVar4->field_0x4 != '\x0f')) {
            if ((uVar2 < component) || (uVar9 <= uVar2)) {
              if (pbVar11[-0xe] == local_40) {
                if (*(uint *)(pbVar11 + -10) == uVar12) {
                  if (*(uint *)(pbVar11 + -6) == interpolation) {
                    if (((pbVar11[-2] == centroid) && (pbVar11[-1] == sample)) &&
                       (*pbVar11 == patch)) goto LAB_001dfbf0;
                    pcVar5 = _mesa_shader_stage_to_string(stage);
                    pcVar7 = " out";
                    if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                        (undefined1  [44])0x4000) {
                      pcVar7 = " in";
                    }
                    pcVar7 = pcVar7 + 1;
                    fmt = 
                    "%s shader has multiple %sputs sharing the same location that don\'t have the same auxiliary storage qualification. Location %u component %u.\n"
                    ;
                  }
                  else {
                    pcVar5 = _mesa_shader_stage_to_string(stage);
                    pcVar7 = " out";
                    if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                        (undefined1  [44])0x4000) {
                      pcVar7 = " in";
                    }
                    pcVar7 = pcVar7 + 1;
                    fmt = 
                    "%s shader has multiple %sputs sharing the same location that don\'t have the same interpolation qualification. Location %u component %u.\n"
                    ;
                  }
                }
                else {
                  pcVar5 = _mesa_shader_stage_to_string(stage);
                  pcVar7 = " out";
                  if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                      (undefined1  [44])0x4000) {
                    pcVar7 = " in";
                  }
                  pcVar7 = pcVar7 + 1;
                  fmt = 
                  "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical bit size. Location %u component %u.\n"
                  ;
                }
              }
              else {
                pcVar5 = _mesa_shader_stage_to_string(stage);
                pcVar7 = " out";
                if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                    (undefined1  [44])0x4000) {
                  pcVar7 = " in";
                }
                pcVar7 = pcVar7 + 1;
                fmt = 
                "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical type. Location %u component %u.\n"
                ;
              }
            }
            else {
              pcVar5 = _mesa_shader_stage_to_string(stage);
              pcVar7 = " out";
              if (((undefined1  [44])var->data & (undefined1  [44])0xf000) ==
                  (undefined1  [44])0x4000) {
                pcVar7 = " in";
              }
              pcVar7 = pcVar7 + 1;
              fmt = 
              "%s shader has multiple %sputs explicitly assigned to location %d and component %d\n";
            }
            linker_error(prog,fmt,pcVar5,pcVar7,(ulong)uVar10,(ulong)uVar2);
          }
          else {
            pcVar5 = _mesa_shader_stage_to_string(stage);
            pcVar7 = " out";
            if (((undefined1  [44])var->data & (undefined1  [44])0xf000) == (undefined1  [44])0x4000
               ) {
              pcVar7 = " in";
            }
            if (!bVar1) {
              var = ((explicit_location_info *)(pbVar11 + -0x16))->var;
            }
            linker_error(prog,
                         "%s shader has multiple %sputs sharing the same location that don\'t have the same underlying numerical type. Struct variable \'%s\', location %u\n"
                         ,pcVar5,pcVar7 + 1,var->name,(ulong)uVar10);
          }
          goto LAB_001dfdd9;
        }
        if ((component <= uVar2) && (uVar2 < uVar9)) {
          ((explicit_location_info *)(pbVar11 + -0x16))->var = var;
          pbVar11[-0xe] = local_40;
          *(uint *)(pbVar11 + -10) = uVar12;
          *(uint *)(pbVar11 + -6) = interpolation;
          pbVar11[-2] = centroid;
          pbVar11[-1] = sample;
          *pbVar11 = patch;
        }
LAB_001dfbf0:
        uVar3 = uVar2 + 1;
        pbVar11 = pbVar11 + 0x18;
        bVar13 = uVar2 != 3;
        uVar2 = uVar3;
      } while ((bVar13) || (uVar9 < 5));
      uVar9 = uVar9 - 4;
      component = 0;
      uVar10 = uVar10 + 1;
    } while( true );
  }
switchD_001dfadc_caseD_e:
  __assert_fail("!\"unknown base type\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.h"
                ,0xbe,"unsigned int glsl_base_type_get_bit_size(const enum glsl_base_type)");
}

Assistant:

static bool
check_location_aliasing(struct explicit_location_info explicit_locations[][4],
                        ir_variable *var,
                        unsigned location,
                        unsigned component,
                        unsigned location_limit,
                        const glsl_type *type,
                        unsigned interpolation,
                        bool centroid,
                        bool sample,
                        bool patch,
                        gl_shader_program *prog,
                        gl_shader_stage stage)
{
   unsigned last_comp;
   unsigned base_type_bit_size;
   const glsl_type *type_without_array = type->without_array();
   const bool base_type_is_integer =
      glsl_base_type_is_integer(type_without_array->base_type);
   const bool is_struct = type_without_array->is_struct();
   if (is_struct) {
      /* structs don't have a defined underlying base type so just treat all
       * component slots as used and set the bit size to 0. If there is
       * location aliasing, we'll fail anyway later.
       */
      last_comp = 4;
      base_type_bit_size = 0;
   } else {
      unsigned dmul = type_without_array->is_64bit() ? 2 : 1;
      last_comp = component + type_without_array->vector_elements * dmul;
      base_type_bit_size =
         glsl_base_type_get_bit_size(type_without_array->base_type);
   }

   while (location < location_limit) {
      unsigned comp = 0;
      while (comp < 4) {
         struct explicit_location_info *info =
            &explicit_locations[location][comp];

         if (info->var) {
            if (info->var->type->without_array()->is_struct() || is_struct) {
               /* Structs cannot share location since they are incompatible
                * with any other underlying numerical type.
                */
               linker_error(prog,
                            "%s shader has multiple %sputs sharing the "
                            "same location that don't have the same "
                            "underlying numerical type. Struct variable '%s', "
                            "location %u\n",
                            _mesa_shader_stage_to_string(stage),
                            var->data.mode == ir_var_shader_in ? "in" : "out",
                            is_struct ? var->name : info->var->name,
                            location);
               return false;
            } else if (comp >= component && comp < last_comp) {
               /* Component aliasing is not allowed */
               linker_error(prog,
                            "%s shader has multiple %sputs explicitly "
                            "assigned to location %d and component %d\n",
                            _mesa_shader_stage_to_string(stage),
                            var->data.mode == ir_var_shader_in ? "in" : "out",
                            location, comp);
               return false;
            } else {
               /* From the OpenGL 4.60.5 spec, section 4.4.1 Input Layout
                * Qualifiers, Page 67, (Location aliasing):
                *
                *   " Further, when location aliasing, the aliases sharing the
                *     location must have the same underlying numerical type
                *     and bit width (floating-point or integer, 32-bit versus
                *     64-bit, etc.) and the same auxiliary storage and
                *     interpolation qualification."
                */

               /* If the underlying numerical type isn't integer, implicitly
                * it will be float or else we would have failed by now.
                */
               if (info->base_type_is_integer != base_type_is_integer) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "underlying numerical type. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->base_type_bit_size != base_type_bit_size) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "underlying numerical bit size. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->interpolation != interpolation) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "interpolation qualification. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }

               if (info->centroid != centroid ||
                   info->sample != sample ||
                   info->patch != patch) {
                  linker_error(prog,
                               "%s shader has multiple %sputs sharing the "
                               "same location that don't have the same "
                               "auxiliary storage qualification. Location %u "
                               "component %u.\n",
                               _mesa_shader_stage_to_string(stage),
                               var->data.mode == ir_var_shader_in ?
                               "in" : "out", location, comp);
                  return false;
               }
            }
         } else if (comp >= component && comp < last_comp) {
            info->var = var;
            info->base_type_is_integer = base_type_is_integer;
            info->base_type_bit_size = base_type_bit_size;
            info->interpolation = interpolation;
            info->centroid = centroid;
            info->sample = sample;
            info->patch = patch;
         }

         comp++;

         /* We need to do some special handling for doubles as dvec3 and
          * dvec4 consume two consecutive locations. We don't need to
          * worry about components beginning at anything other than 0 as
          * the spec does not allow this for dvec3 and dvec4.
          */
         if (comp == 4 && last_comp > 4) {
            last_comp = last_comp - 4;
            /* Bump location index and reset the component index */
            location++;
            comp = 0;
            component = 0;
         }
      }

      location++;
   }

   return true;
}